

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableElement.cpp
# Opt level: O0

void __thiscall
KDReports::TableElementPrivate::createCell
          (TableElementPrivate *this,QTextTable *textTable,ReportBuilder *builder,int row,int column
          ,Cell *cell,QTextCharFormat *charFormat)

{
  bool bVar1;
  int iVar2;
  BrushStyle BVar3;
  AlignmentFlag AVar4;
  VerticalAlignment alignment;
  undefined8 uVar5;
  TextDocumentData *contentDocument;
  Report *report;
  QFont local_128 [16];
  undefined1 local_118 [8];
  ReportBuilder cellBuilder;
  CellFormatFunc func;
  undefined1 local_78 [8];
  undefined1 local_70 [16];
  QTextTableCellFormat tableCellFormat;
  QTextCharFormat local_58 [8];
  QTextCursor cellCursor;
  QTextTableCell local_40 [8];
  QTextTableCell tableCell;
  Cell *cell_local;
  int column_local;
  int row_local;
  ReportBuilder *builder_local;
  QTextTable *textTable_local;
  TableElementPrivate *this_local;
  
  iVar2 = Cell::columnSpan(cell);
  if ((1 < iVar2) || (iVar2 = Cell::rowSpan(cell), 1 < iVar2)) {
    iVar2 = Cell::rowSpan(cell);
    Cell::columnSpan(cell);
    QTextTable::mergeCells((int)textTable,row,column,iVar2);
  }
  QTextTable::cellAt((int)local_40,(int)textTable);
  bVar1 = QTextTableCell::isValid(local_40);
  if (bVar1) {
    QTextTableCell::firstCursorPosition();
    QTextFormat::toTableCellFormat();
    Element::background((Element *)local_70);
    BVar3 = QBrush::style((QBrush *)local_70);
    QBrush::~QBrush((QBrush *)local_70);
    if (BVar3 != NoBrush) {
      Element::background((Element *)local_78);
      QTextFormat::setBackground((QTextFormat *)(local_70 + 8),(QBrush *)local_78);
      QBrush::~QBrush((QBrush *)local_78);
    }
    iVar2 = Cell::columnSpan(cell);
    QTextCharFormat::setTableCellColumnSpan((QTextCharFormat *)(local_70 + 8),iVar2);
    iVar2 = Cell::rowSpan(cell);
    QTextCharFormat::setTableCellRowSpan((QTextCharFormat *)(local_70 + 8),iVar2);
    AVar4 = Cell::verticalAlignment(cell);
    if (AVar4 != 0) {
      AVar4 = Cell::verticalAlignment(cell);
      QFlags<Qt::AlignmentFlag>::QFlags
                ((QFlags<Qt::AlignmentFlag> *)((long)&func._M_invoker + 4),AVar4);
      alignment = ReportBuilder::toVerticalAlignment(func._M_invoker._4_4_);
      QTextCharFormat::setVerticalAlignment((QTextCharFormat *)(local_70 + 8),alignment);
    }
    Cell::cellFormatFunction((CellFormatFunc *)&cellBuilder.m_first,cell);
    bVar1 = std::function::operator_cast_to_bool((function *)&cellBuilder.m_first);
    if (bVar1) {
      std::function<void_(int,_int,_QTextTableCellFormat_&)>::operator()
                ((function<void_(int,_int,_QTextTableCellFormat_&)> *)&cellBuilder.m_first,row,
                 column,(QTextTableCellFormat *)(local_70 + 8));
    }
    std::function<void_(int,_int,_QTextTableCellFormat_&)>::~function
              ((function<void_(int,_int,_QTextTableCellFormat_&)> *)&cellBuilder.m_first);
    QTextTableCell::setFormat((QTextCharFormat *)local_40);
    QTextCursor::setCharFormat(local_58);
    contentDocument = ReportBuilder::currentDocumentData(builder);
    report = ReportBuilder::report(builder);
    ReportBuilder::ReportBuilder
              ((ReportBuilder *)local_118,contentDocument,(QTextCursor *)local_58,report);
    ReportBuilder::copyStateFrom((ReportBuilder *)local_118,builder);
    QTextCharFormat::font();
    ReportBuilder::setDefaultFont((ReportBuilder *)local_118,local_128);
    QFont::~QFont(local_128);
    Cell::build(cell,(ReportBuilder *)local_118);
    ReportBuilder::~ReportBuilder((ReportBuilder *)local_118);
    QTextTableCellFormat::~QTextTableCellFormat((QTextTableCellFormat *)(local_70 + 8));
    QTextCursor::~QTextCursor((QTextCursor *)local_58);
    QTextTableCell::~QTextTableCell(local_40);
    return;
  }
  uVar5 = qt_assert("tableCell.isValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsTableElement.cpp"
                    ,0x73);
  QTextTableCell::~QTextTableCell(local_40);
  _Unwind_Resume(uVar5);
}

Assistant:

void KDReports::TableElementPrivate::createCell(QTextTable *textTable, ReportBuilder &builder, int row, int column, const Cell &cell, const QTextCharFormat &charFormat) const
{
    if (cell.columnSpan() > 1 || cell.rowSpan() > 1)
        textTable->mergeCells(row, column, cell.rowSpan(), cell.columnSpan());
    QTextTableCell tableCell = textTable->cellAt(row, column);
    Q_ASSERT(tableCell.isValid());
    QTextCursor cellCursor = tableCell.firstCursorPosition();
    QTextTableCellFormat tableCellFormat(charFormat.toTableCellFormat());
    if (cell.background().style() != Qt::NoBrush)
        tableCellFormat.setBackground(cell.background());
    tableCellFormat.setTableCellColumnSpan(cell.columnSpan());
    tableCellFormat.setTableCellRowSpan(cell.rowSpan());
    if (cell.verticalAlignment() != 0)
        tableCellFormat.setVerticalAlignment(ReportBuilder::toVerticalAlignment(cell.verticalAlignment()));
    if (auto func = cell.cellFormatFunction())
        func(row, column, tableCellFormat);
    tableCell.setFormat(tableCellFormat);
    cellCursor.setCharFormat(tableCellFormat);
    ReportBuilder cellBuilder(builder.currentDocumentData(), cellCursor, builder.report());
    cellBuilder.copyStateFrom(builder);
    cellBuilder.setDefaultFont(charFormat.font());
    cell.build(cellBuilder);
}